

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmVarHeapHybrid::~CVmVarHeapHybrid(CVmVarHeapHybrid *this)

{
  CVmVarHeapHybrid_head *pCVar1;
  CVmVarHeapHybrid_array *pCVar2;
  CVmVarHeapHybrid_array *__ptr;
  ulong uVar3;
  
  (this->super_CVmVarHeap)._vptr_CVmVarHeap = (_func_int **)&PTR__CVmVarHeapHybrid_00360710;
  for (uVar3 = 0; uVar3 < this->cell_heap_cnt_; uVar3 = uVar3 + 1) {
    pCVar1 = this->cell_heaps_[uVar3];
    if (pCVar1 != (CVmVarHeapHybrid_head *)0x0) {
      (*(pCVar1->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block[1])();
    }
  }
  free(this->cell_heaps_);
  __ptr = this->first_array_;
  while (__ptr != (CVmVarHeapHybrid_array *)0x0) {
    pCVar2 = __ptr->next_array;
    free(__ptr);
    this->first_array_ = pCVar2;
    __ptr = pCVar2;
  }
  if (this->malloc_heap_ != (CVmVarHeapHybrid_malloc *)0x0) {
    (*(this->malloc_heap_->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block[1])();
    return;
  }
  return;
}

Assistant:

CVmVarHeapHybrid::~CVmVarHeapHybrid()
{
    size_t i;
    
    /* delete our cell heaps */
    for (i = 0 ; i < cell_heap_cnt_ ; ++i)
        delete cell_heaps_[i];

    /* delete the cell heap pointer array */
    t3free(cell_heaps_);

    /* delete all of the arrays */
    while (first_array_ != 0)
    {
        CVmVarHeapHybrid_array *nxt;

        /* remember the next one */
        nxt = first_array_->next_array;

        /* delete this one */
        t3free(first_array_);

        /* move on to the next one */
        first_array_ = nxt;
    }

    /* delete the malloc-based subheap manager */
    delete malloc_heap_;
}